

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O1

Real N_VMinQuotient_MultiFab(N_Vector num,N_Vector denom)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  MFIter mfi;
  IntVect local_138;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)num->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)denom->content + 8);
  uVar1 = (this->super_FabArrayBase).n_comp;
  local_138.vect[0] = 0;
  local_138.vect[1] = 0;
  local_138.vect[2] = 0;
  amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    dVar14 = 1.79769313486232e+308;
    do {
      amrex::MFIter::growntilebox(&local_12c,&local_90,&local_138);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,this,&local_90);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,this_00,&local_90);
      dVar16 = 1.79769313486232e+308;
      if (0 < (int)uVar1) {
        lVar5 = (long)local_12c.smallend.vect[2];
        lVar11 = (long)local_12c.smallend.vect[1];
        lVar2 = (lVar11 - local_d0.begin.y) * local_d0.jstride * 8 +
                (lVar5 - local_d0.begin.z) * local_d0.kstride * 8 +
                (long)local_12c.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 +
                (long)local_d0.p;
        lVar7 = (lVar11 - local_110.begin.y) * local_110.jstride * 8 +
                (lVar5 - local_110.begin.z) * local_110.kstride * 8 +
                (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
                (long)local_110.p;
        dVar16 = 1.79769313486232e+308;
        uVar10 = 0;
        do {
          lVar3 = lVar2;
          lVar4 = lVar7;
          lVar8 = lVar5;
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              lVar9 = lVar11;
              lVar12 = lVar4;
              lVar13 = lVar3;
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar6 = 0;
                    do {
                      dVar15 = *(double *)(lVar12 + lVar6 * 8);
                      if (((dVar15 != 0.0) || (NAN(dVar15))) &&
                         (dVar15 = *(double *)(lVar13 + lVar6 * 8) / dVar15, dVar15 <= dVar16)) {
                        dVar16 = dVar15;
                      }
                      lVar6 = lVar6 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar6);
                  }
                  lVar9 = lVar9 + 1;
                  lVar13 = lVar13 + local_d0.jstride * 8;
                  lVar12 = lVar12 + local_110.jstride * 8;
                } while (local_12c.bigend.vect[1] + 1 != (int)lVar9);
              }
              lVar8 = lVar8 + 1;
              lVar3 = lVar3 + local_d0.kstride * 8;
              lVar4 = lVar4 + local_110.kstride * 8;
            } while (local_12c.bigend.vect[2] + 1 != (int)lVar8);
          }
          uVar10 = uVar10 + 1;
          lVar2 = lVar2 + local_d0.nstride * 8;
          lVar7 = lVar7 + local_110.nstride * 8;
        } while (uVar10 != uVar1);
      }
      if (dVar14 <= dVar16) {
        dVar16 = dVar14;
      }
      dVar14 = dVar16;
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  else {
    dVar14 = 1.79769313486232e+308;
  }
  amrex::MFIter::~MFIter(&local_90);
  return dVar14;
}

Assistant:

amrex::Real N_VMinQuotient_MultiFab(N_Vector num, N_Vector denom)
{
    using namespace amrex;

    amrex::MultiFab *mf_num = amrex::sundials::getMFptr(num);
    amrex::MultiFab *mf_denom = amrex::sundials::getMFptr(denom);
    sunindextype ncomp = mf_num->nComp();

    // ghost cells not included
    int nghost = 0;
    Real min = amrex::ReduceMin(*mf_num, *mf_denom, nghost,
                 [=] AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& num_fab, Array4<Real const> const& denom_fab) -> Real
    {
         Real min_loc = std::numeric_limits<Real>::max();
         const auto lo = lbound(bx);
         const auto hi = ubound(bx);

         for (int c = 0; c < ncomp; ++c) {
            for (int k = lo.z; k <= hi.z; ++k) {
               for (int j = lo.y; j <= hi.y; ++j) {
                  for (int i = lo.x; i <= hi.x; ++i) {
                     if (denom_fab(i,j,k,c) != amrex::Real(0.0))
                     {
                        amrex::Real num = num_fab(i,j,k,c);
                        amrex::Real denom = denom_fab(i,j,k,c);
                        min_loc = SUNMIN(min_loc, num / denom);
                     }
                  }
               }
            }
         }
         return min_loc;
     });

    amrex::ParallelDescriptor::ReduceRealMin(min);

    return min;
}